

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O0

int __thiscall amrex::EBCellFlagFab::getNumCoveredCells(EBCellFlagFab *this,Box *bx_in)

{
  uint uVar1;
  bool bVar2;
  Long LVar3;
  pointer ppVar4;
  int *in_RSI;
  EBCellFlagFab *in_RDI;
  NumCells *t;
  Array4<const_amrex::EBCellFlag> *flag;
  iterator it;
  Box bx_1;
  Box *bx;
  FabType thistype;
  int i;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  _Rb_tree_iterator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>
  *in_stack_fffffffffffffd70;
  Array4<const_amrex::EBCellFlag> *this_00;
  Box *in_stack_fffffffffffffd80;
  NumCells *__b;
  NumCells *this_01;
  Box *in_stack_fffffffffffffde8;
  Array4<const_amrex::EBCellFlag> *in_stack_fffffffffffffdf0;
  Array4<const_amrex::EBCellFlag> local_1f8;
  Array4<const_amrex::EBCellFlag> *local_1b8;
  _Self local_1b0;
  _Base_ptr local_1a8;
  _Rb_tree_iterator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_> local_1a0;
  Box local_194;
  Box *local_178;
  FabType local_16c;
  int *local_168;
  int local_154;
  int *local_150;
  int local_13c;
  Box *local_138;
  int local_12c;
  IndexType *local_128;
  undefined4 local_120;
  int local_11c;
  IntVect *local_118;
  IndexType *local_110;
  int local_104;
  IndexType *local_100;
  int local_f4;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  EBCellFlag *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_168 = in_RSI;
  local_16c = getType(in_RDI);
  local_150 = local_168;
  local_194.smallend.vect._0_8_ = *(undefined8 *)local_168;
  local_194.smallend.vect[2] = local_168[2];
  local_194.bigend.vect[0] = local_168[3];
  local_194.bigend.vect._4_8_ = *(undefined8 *)(local_168 + 4);
  uVar1 = local_168[6];
  local_138 = &local_194;
  for (local_13c = 0; local_13c < 3; local_13c = local_13c + 1) {
    local_128 = &local_194.btype;
    local_12c = local_13c;
    local_104 = local_13c;
    local_f4 = local_13c;
    if ((uVar1 & 1 << ((byte)local_13c & 0x1f)) != 0) {
      local_118 = &local_194.bigend;
      local_11c = local_13c;
      local_120 = 0xffffffff;
      local_118->vect[local_13c] = local_118->vect[local_13c] + -1;
    }
    local_100 = local_128;
  }
  local_110 = &local_194.btype;
  local_194.btype.itype = 0;
  local_178 = &local_194;
  if (local_16c == regular) {
    local_154 = 0;
  }
  else if (local_16c == covered) {
    LVar3 = Box::numPts(in_stack_fffffffffffffd80);
    local_154 = (int)LVar3;
  }
  else {
    std::_Rb_tree_iterator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>::
    _Rb_tree_iterator(&local_1a0);
    local_1a8 = (_Base_ptr)
                std::
                map<amrex::Box,_amrex::EBCellFlagFab::NumCells,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
                ::find((map<amrex::Box,_amrex::EBCellFlagFab::NumCells,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
                        *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                       (key_type *)0x14162fe);
    local_1a0._M_node = local_1a8;
    local_1b0._M_node =
         (_Base_ptr)
         std::
         map<amrex::Box,_amrex::EBCellFlagFab::NumCells,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
         ::end((map<amrex::Box,_amrex::EBCellFlagFab::NumCells,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
                *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    bVar2 = std::operator!=(&local_1a0,&local_1b0);
    if (bVar2) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>
               ::operator->(in_stack_fffffffffffffd70);
      local_154 = (ppVar4->second).ncovered;
    }
    else {
      local_a8 = (in_RDI->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_b0 = &(in_RDI->super_BaseFab<amrex::EBCellFlag>).domain;
      local_b4 = (in_RDI->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_5c = 0;
      local_88 = (local_b0->smallend).vect[0];
      local_6c = 1;
      iStack_84 = (in_RDI->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      local_d0.x = (local_b0->smallend).vect[0];
      local_d0.y = (local_b0->smallend).vect[1];
      local_7c = 2;
      local_d0.z = (in_RDI->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_8 = &(in_RDI->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_c = 0;
      local_38 = local_8->vect[0] + 1;
      local_18 = &(in_RDI->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_1c = 1;
      iStack_34 = (in_RDI->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      local_28 = &(in_RDI->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_2c = 2;
      local_f0.z = (in_RDI->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_f0.y = iStack_34;
      local_f0.x = local_38;
      this_00 = &local_1f8;
      local_e0._0_8_ = local_f0._0_8_;
      local_e0.z = local_f0.z;
      local_c0._0_8_ = local_d0._0_8_;
      local_c0.z = local_d0.z;
      local_a0._0_8_ = local_d0._0_8_;
      local_a0.z = local_d0.z;
      local_90 = local_b0;
      local_80 = local_d0.z;
      local_78 = local_b0;
      local_68 = local_b0;
      local_58 = local_b0;
      local_50._0_8_ = local_f0._0_8_;
      local_50.z = local_f0.z;
      local_40 = local_b0;
      local_30 = local_f0.z;
      Array4<const_amrex::EBCellFlag>::Array4(this_00,local_a8,&local_c0,&local_e0,local_b4);
      __b = (NumCells *)&stack0xfffffffffffffdec;
      local_1b8 = this_00;
      anon_unknown_26::countCells(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      this_01 = __b;
      std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>::
      pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells,_true>
                ((pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells> *)&stack0xfffffffffffffdbc,
                 local_178,__b);
      std::
      map<amrex::Box,_amrex::EBCellFlagFab::NumCells,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
      ::insert((map<amrex::Box,_amrex::EBCellFlagFab::NumCells,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
                *)this_01,(value_type *)this_00);
      local_154 = __b->ncovered;
    }
  }
  return local_154;
}

Assistant:

int
EBCellFlagFab::getNumCoveredCells (const Box& bx_in) const noexcept
{
    FabType thistype = getType();

    const Box& bx = amrex::enclosedCells(bx_in);

    if (thistype == FabType::regular)
    {
        return 0;
    }
    else if (thistype == FabType::covered)
    {
        return static_cast<int>(bx.numPts());
    }
    else
    {
        std::map<Box,NumCells>::iterator it;
#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_ebcellflagfab_gettype)
#endif
        it = m_typemap.find(bx);
        if (it != m_typemap.end())
        {
            return it->second.ncovered;
        }
        else
        {
            auto const& flag = this->const_array();
            auto const& t = countCells(flag, bx);

#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_ebcellflagfab_gettype)
#endif
            m_typemap.insert({bx,t});

            return t.ncovered;
        }
    }
}